

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_tls_read_group(mbedtls_ecp_group *grp,uchar **buf,size_t len)

{
  mbedtls_ecp_curve_info *pmVar1;
  uchar uVar2;
  uchar *puVar3;
  int iVar4;
  mbedtls_ecp_curve_info *curve_info;
  mbedtls_ecp_curve_info *pmVar5;
  
  curve_info._0_4_ = -0x4f80;
  if (2 < len) {
    puVar3 = *buf;
    *buf = puVar3 + 1;
    if (*puVar3 == '\x03') {
      *buf = puVar3 + 2;
      uVar2 = puVar3[1];
      *buf = puVar3 + 3;
      pmVar5 = ecp_supported_curves;
      do {
        if (pmVar5->tls_id == CONCAT11(uVar2,puVar3[2])) goto LAB_001e407d;
        pmVar1 = pmVar5 + 1;
        pmVar5 = pmVar5 + 1;
      } while (pmVar1->grp_id != MBEDTLS_ECP_DP_NONE);
      pmVar5 = (mbedtls_ecp_curve_info *)0x0;
LAB_001e407d:
      if (pmVar5 != (mbedtls_ecp_curve_info *)0x0) {
        iVar4 = mbedtls_ecp_group_load(grp,pmVar5->grp_id);
        return iVar4;
      }
      curve_info._0_4_ = -0x4e80;
    }
  }
  return (int)curve_info;
}

Assistant:

int mbedtls_ecp_tls_read_group( mbedtls_ecp_group *grp, const unsigned char **buf, size_t len )
{
    uint16_t tls_id;
    const mbedtls_ecp_curve_info *curve_info;

    /*
     * We expect at least three bytes (see below)
     */
    if( len < 3 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    /*
     * First byte is curve_type; only named_curve is handled
     */
    if( *(*buf)++ != MBEDTLS_ECP_TLS_NAMED_CURVE )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    /*
     * Next two bytes are the namedcurve value
     */
    tls_id = *(*buf)++;
    tls_id <<= 8;
    tls_id |= *(*buf)++;

    if( ( curve_info = mbedtls_ecp_curve_info_from_tls_id( tls_id ) ) == NULL )
        return( MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE );

    return mbedtls_ecp_group_load( grp, curve_info->grp_id );
}